

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_pool_free_fibers_from_pool
               (cilk_fiber_pool *pool,uint num_to_keep,cilk_fiber *fiber_to_return)

{
  long lVar1;
  uint uVar2;
  cilk_fiber *in_RDX;
  uint in_ESI;
  cilk_fiber_pool *in_RDI;
  int i;
  int fibers_freed;
  cilk_fiber *fibers_to_free [10];
  int num_to_free;
  int B;
  bool last_fiber_returned;
  bool need_lock;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 auStack_78 [10];
  int local_24;
  undefined4 local_20;
  byte local_1a;
  byte local_19;
  cilk_fiber *local_18;
  uint local_c;
  cilk_fiber_pool *local_8;
  
  local_19 = in_RDI->lock != (spin_mutex *)0x0;
  local_1a = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    local_20 = 10;
    local_24 = 0;
    if ((local_19 & 1) != 0) {
      spin_mutex_lock((spin_mutex *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    in_stack_ffffffffffffff84 = 0;
    while (local_c < local_8->size && local_24 < 10) {
      uVar2 = local_8->size - 1;
      local_8->size = uVar2;
      lVar1 = (long)local_24;
      local_24 = local_24 + 1;
      auStack_78[lVar1] = local_8->fibers[uVar2];
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1;
    }
    decrement_pool_total(local_8,in_stack_ffffffffffffff84);
    if (local_8->size <= local_c) {
      if (local_18 != (cilk_fiber *)0x0) {
        if (local_8->max_size <= local_8->size) {
          __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                        ,0x9c,"pool->size < pool->max_size");
        }
        local_8->fibers[local_8->size] = local_18;
        local_8->size = local_8->size + 1;
      }
      local_1a = 1;
    }
    if ((local_19 & 1) != 0) {
      spin_mutex_unlock((spin_mutex *)0x108f26);
    }
    for (in_stack_ffffffffffffff80 = 0; in_stack_ffffffffffffff80 < local_24;
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1) {
      cilk_fiber::deallocate_to_heap
                ((cilk_fiber *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  } while (((local_1a ^ 0xff) & 1) != 0);
  return;
}

Assistant:

static void cilk_fiber_pool_free_fibers_from_pool(cilk_fiber_pool* pool,
                                                  unsigned num_to_keep,
                                                  cilk_fiber* fiber_to_return)
{
    // Free our own fibers, until we fall below our desired threshold.
    // Each iteration of this loop proceeds in the following stages:
    //   1.  Acquire the pool lock,
    //   2.  Grabs up to B fibers from the pool, stores them into a buffer.
    //   3.  Check if pool is empty enough.  If yes, put the last fiber back,
    //       and remember that we should quit.
    //   4.  Release the pool lock, and actually free any buffered fibers.
    //   5.  Check if we are done and should exit the loop.  Otherwise, try again.
    // 
    const bool need_lock = pool->lock;
    bool last_fiber_returned = false;
    
    do {
        const int B = 10;   // Pull at most this many fibers from the
                            // parent for one lock acquisition.  Make
                            // this value large enough to amortize
                            // against the cost of acquiring and
                            // releasing the lock.
        int num_to_free = 0;
        cilk_fiber* fibers_to_free[B];

        // Stage 1: Grab the lock.
        if (need_lock) {
            spin_mutex_lock(pool->lock);
        }
        
        // Stage 2: Grab up to B fibers to free.
        int fibers_freed = 0;
        while ((pool->size > num_to_keep) && (num_to_free < B)) {
            fibers_to_free[num_to_free++] = pool->fibers[--pool->size];
            fibers_freed++;
        }
        decrement_pool_total(pool, fibers_freed);

        // Stage 3.  Pool is below threshold.  Put extra fiber back.
        if (pool->size <= num_to_keep) {
            // Put the last fiber back into the pool.
            if (fiber_to_return) {
                CILK_ASSERT(pool->size < pool->max_size);
                pool->fibers[pool->size] = fiber_to_return;
                pool->size++;
            }
            last_fiber_returned = true;
        }
        
        // Stage 4: Release the lock, and actually free any fibers
        // buffered.
        if (need_lock) {
            spin_mutex_unlock(pool->lock);
        }

        for (int i = 0; i < num_to_free; ++i) {
            fibers_to_free[i]->deallocate_to_heap();
        }
        
    } while (!last_fiber_returned);
}